

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collectives.cpp
# Opt level: O0

void diy::mpi::detail::scan
               (communicator *comm,void *dataIn,void *dataOut,int count,datatype *type,operation *op
               )

{
  MPI_Datatype poVar1;
  MPI_Op poVar2;
  MPI_Datatype *ppoVar3;
  MPI_Op *ppoVar4;
  MPI_Comm *ppoVar5;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  communicator *in_RDI;
  DIY_MPI_Datatype *in_R8;
  DIY_MPI_Op *in_R9;
  DIY_MPI_Comm local_38;
  DIY_MPI_Op *local_30;
  communicator *local_8;
  
  local_30 = in_R9;
  local_8 = in_RDI;
  ppoVar3 = mpi_cast(in_R8);
  poVar1 = *ppoVar3;
  ppoVar4 = mpi_cast(local_30);
  poVar2 = *ppoVar4;
  local_38 = communicator::handle(local_8);
  ppoVar5 = mpi_cast(&local_38);
  MPI_Scan(in_RSI,in_RDX,in_ECX,poVar1,poVar2,*ppoVar5);
  return;
}

Assistant:

void scan(const communicator& comm,
          const void* dataIn, void* dataOut, int count, const datatype& type,
          const operation& op)
{
#if DIY_HAS_MPI
  MPI_Scan(dataIn, dataOut, count, mpi_cast(type.handle), mpi_cast(op.handle), mpi_cast(comm.handle()));
#else
  copy_buffer(dataIn, dataOut, mpi_cast(type.handle), count);
  (void)comm; (void)op;
#endif
}